

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd1D.c
# Opt level: O0

void dump_1D_fdtd(fdtd1D *fdtd,char *fileName,dumpable_data what_to_dump)

{
  double dVar1;
  undefined1 auVar2 [16];
  FILE *__stream;
  uint in_EDX;
  char *in_RSI;
  double *in_RDI;
  undefined1 in_ZMM0 [64];
  uintmax_t i;
  float_type *array;
  FILE *out;
  double local_30;
  double local_28;
  
  __stream = fopen(in_RSI,"w");
  switch(in_EDX) {
  case 2:
    local_28 = in_RDI[2];
    break;
  default:
    fprintf(_stderr,"Dump of \"%s\" not available for 1D fdtd\n",dumpable_data_name[in_EDX]);
    exit(1);
  case 4:
    local_28 = in_RDI[3];
    break;
  case 6:
    local_28 = in_RDI[4];
    break;
  case 7:
    local_28 = in_RDI[5];
  }
  for (local_30 = 0.0; (ulong)local_30 < (ulong)in_RDI[8]; local_30 = (double)((long)local_30 + 1))
  {
    auVar2 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,local_30);
    dVar1 = auVar2._0_8_ * *in_RDI;
    in_ZMM0 = ZEXT864((ulong)dVar1);
    fprintf(__stream,"%e %e\n",dVar1,*(undefined8 *)((long)local_28 + (long)local_30 * 8));
  }
  fclose(__stream);
  return;
}

Assistant:

void dump_1D_fdtd(const struct fdtd1D *fdtd, const char *fileName,
                  enum dumpable_data what_to_dump) {
  FILE *out = fopen(fileName, "w");
  float_type *array;
  switch (what_to_dump) {
  case dump_ez:
    array = fdtd->ez;
    break;
  case dump_hy:
    array = fdtd->hy;
    break;
  case dump_permeability:
    array = fdtd->permeability_inv;
    break;
  case dump_permittivity:
    array = fdtd->permittivity_inv;
    break;
  default:
    fprintf(stderr, "Dump of \"%s\" not available for 1D fdtd\n",
            dumpable_data_name[what_to_dump]);
    exit(EXIT_FAILURE);
  }
  for (uintmax_t i = 0; i < fdtd->sizeX; ++i) {
    fprintf(out, "%e %e\n", (float_type)i * fdtd->dx, array[i]);
  }
  fclose(out);
}